

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompMultiplicativeExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  byte *pbVar1;
  ulong uVar2;
  long lVar3;
  int value;
  
  xmlXPathCompUnaryExpr(ctxt);
  if (ctxt->error != 0) {
    return;
  }
  pbVar1 = ctxt->cur;
  while ((uVar2 = (ulong)*pbVar1, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
    pbVar1 = pbVar1 + 1;
    ctxt->cur = pbVar1;
  }
  do {
    if ((char)uVar2 == '*') {
      value = 0;
      lVar3 = 1;
    }
    else {
      lVar3 = 3;
      if ((int)uVar2 == 0x6d) {
        if (pbVar1[1] != 0x6f) {
          return;
        }
        if (pbVar1[2] != 100) {
          return;
        }
        value = 2;
      }
      else {
        if ((int)uVar2 != 100) {
          return;
        }
        if (pbVar1[1] != 0x69) {
          return;
        }
        if (pbVar1[2] != 0x76) {
          return;
        }
        value = 1;
      }
    }
    ch1 = ctxt->comp->last;
    pbVar1 = pbVar1 + lVar3;
    while( true ) {
      ctxt->cur = pbVar1;
      if ((0x20 < (ulong)*pbVar1) || ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) break;
      pbVar1 = pbVar1 + 1;
    }
    xmlXPathCompUnaryExpr(ctxt);
    if (ctxt->error != 0) {
      return;
    }
    xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_MULT,value,0,0,(void *)0x0,(void *)0x0);
    pbVar1 = ctxt->cur;
    while ((uVar2 = (ulong)*pbVar1, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
      pbVar1 = pbVar1 + 1;
      ctxt->cur = pbVar1;
    }
  } while( true );
}

Assistant:

static void
xmlXPathCompMultiplicativeExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompUnaryExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '*') ||
           ((CUR == 'd') && (NXT(1) == 'i') && (NXT(2) == 'v')) ||
           ((CUR == 'm') && (NXT(1) == 'o') && (NXT(2) == 'd'))) {
	int op = -1;
	int op1 = ctxt->comp->last;

        if (CUR == '*') {
	    op = 0;
	    NEXT;
	} else if (CUR == 'd') {
	    op = 1;
	    SKIP(3);
	} else if (CUR == 'm') {
	    op = 2;
	    SKIP(3);
	}
	SKIP_BLANKS;
        xmlXPathCompUnaryExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_MULT, op1, ctxt->comp->last, op, 0);
	SKIP_BLANKS;
    }
}